

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase1273::run(TestCase1273 *this)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  undefined8 uVar3;
  void *pvVar4;
  long *plVar5;
  TransformPromiseNodeBase *pTVar6;
  AttachmentPromiseNodeBase *this_00;
  bool bVar7;
  bool destroyed;
  Promise<int> promise;
  DebugExpression<bool> _kjCondition;
  WaitScope waitScope;
  EventLoop loop;
  undefined1 local_129;
  OwnPromiseNode local_128;
  OwnPromiseNode local_120;
  DebugComparison<int,_int> local_118;
  EventLoop *local_f8;
  byte local_f0 [8];
  long local_e8;
  byte abStack_e0 [12];
  __pid_t local_d4;
  char *local_d0;
  char *pcStack_c8;
  byte local_c0 [8];
  char *local_b8;
  char *pcStack_b0;
  byte local_a8 [8];
  EventLoop local_a0;
  
  local_129 = '\0';
  EventLoop::EventLoop(&local_a0);
  local_f0[0] = 0xff;
  local_f0[1] = 0xff;
  local_f0[2] = 0xff;
  local_f0[3] = 0xff;
  local_e8 = 0;
  abStack_e0[0] = '\0';
  abStack_e0[1] = '\0';
  abStack_e0[2] = '\0';
  abStack_e0[3] = '\0';
  abStack_e0[4] = '\0';
  abStack_e0[5] = '\0';
  abStack_e0[6] = '\0';
  abStack_e0[7] = '\0';
  local_f8 = &local_a0;
  EventLoop::enterScope(&local_a0);
  yield();
  uVar3 = local_118._0_8_;
  pPVar1 = *(PromiseArena **)(local_118._0_8_ + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_118._0_8_ - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    pTVar6 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,(OwnPromiseNode *)&local_118,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1279:36)>
               ::anon_class_8_1_8c041cb9_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00628538;
    *(undefined1 **)((long)pvVar4 + 0x3f8) = &local_129;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    *(PromiseArena **)(local_118._0_8_ + 8) = (PromiseArena *)0x0;
    pTVar6 = (TransformPromiseNodeBase *)&((PromiseArenaMember *)(local_118._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,(OwnPromiseNode *)&local_118,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1279:36)>
               ::anon_class_8_1_8c041cb9_for_func::operator());
    ((PromiseArenaMember *)(uVar3 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00628538;
    ((PromiseArenaMember *)(uVar3 + -0x10))->arena = (PromiseArena *)&local_129;
    ((PromiseArenaMember *)(uVar3 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar3 = local_118._0_8_;
  local_120.ptr = &pTVar6->super_PromiseNode;
  if ((PromiseArenaMember *)local_118._0_8_ != (PromiseArenaMember *)0x0) {
    local_118._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  plVar5 = (long *)operator_new(8);
  OVar2.ptr = local_120.ptr;
  *plVar5 = (long)&local_129;
  pPVar1 = ((local_120.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_120.ptr - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    this_00 = (AttachmentPromiseNodeBase *)((long)pvVar4 + 0x3d8);
    kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,&local_120);
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00628590;
    *(undefined8 **)((long)pvVar4 + 0x3f0) =
         &kj::_::HeapDisposer<kj::(anonymous_namespace)::DestructorDetector>::instance;
    *(long **)((long)pvVar4 + 0x3f8) = plVar5;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    ((local_120.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (AttachmentPromiseNodeBase *)((OwnPromiseNode *)(local_120.ptr + -3) + 1);
    kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,&local_120);
    ((OwnPromiseNode *)(OVar2.ptr + -3))[1] = (OwnPromiseNode)&PTR_destroy_00628590;
    ((OwnPromiseNode *)(OVar2.ptr + -1))->ptr =
         (PromiseNode *)
         &kj::_::HeapDisposer<kj::(anonymous_namespace)::DestructorDetector>::instance;
    ((OwnPromiseNode *)(OVar2.ptr + -1))[1] = (OwnPromiseNode)plVar5;
    (((TransformPromiseNodeBase *)(OVar2.ptr + -2))->super_PromiseNode).super_PromiseArenaMember.
    _vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  OVar2.ptr = local_120.ptr;
  local_128.ptr = &this_00->super_PromiseNode;
  if ((TransformPromiseNodeBase *)local_120.ptr != (TransformPromiseNodeBase *)0x0) {
    local_120.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_128.ptr;
  pPVar1 = ((local_128.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_128.ptr - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    pTVar6 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,&local_128,
               kj::_::
               SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1284:26)>
               ::anon_class_8_1_8c041cb9_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00628618;
    *(PromiseNode **)((long)pvVar4 + 0x3f8) = (PromiseNode *)&local_129;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    ((local_128.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar6 = (TransformPromiseNodeBase *)
             &(((AttachmentPromiseNodeBase *)(local_128.ptr + -3))->super_PromiseNode).
              super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,&local_128,
               kj::_::
               SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1284:26)>
               ::anon_class_8_1_8c041cb9_for_func::operator());
    (((AttachmentPromiseNodeBase *)(OVar2.ptr + -3))->super_PromiseNode).super_PromiseArenaMember.
    arena = (PromiseArena *)&PTR_destroy_00628618;
    *(PromiseNode **)((long)(OVar2.ptr + -1) + 8) = (PromiseNode *)&local_129;
    ((OwnPromiseNode *)(OVar2.ptr + -2))->ptr = (PromiseNode *)pPVar1;
  }
  OVar2.ptr = local_128.ptr;
  bVar7 = (AttachmentPromiseNodeBase *)local_128.ptr != (AttachmentPromiseNodeBase *)0x0;
  local_128.ptr = &pTVar6->super_PromiseNode;
  if (bVar7) {
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  local_118._0_8_ = CONCAT71(local_118._1_7_,local_129) ^ 1;
  if ((local_129 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x509,ERROR,"\"failed: expected \" \"!(destroyed)\", _kjCondition",
               (char (*) [30])"failed: expected !(destroyed)",(DebugExpression<bool> *)&local_118);
  }
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_b0 = "run";
  local_a8[0] = '\n';
  local_a8[1] = '\x05';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = ')';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_118.right = Promise<int>::wait((Promise<int> *)&local_128,&local_f8);
  local_118.left = 0x1bc;
  local_118.op.content.ptr = " == ";
  local_118.op.content.size_ = 5;
  local_118.result = local_118.right == 0x1bc;
  if ((!local_118.result) && (kj::_::Debug::minSeverity < 3)) {
    local_120.ptr._0_4_ = 0x1bc;
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_c8 = "run";
    local_c0[0] = '\n';
    local_c0[1] = '\x05';
    local_c0[2] = '\0';
    local_c0[3] = '\0';
    local_c0[4] = ')';
    local_c0[5] = '\0';
    local_c0[6] = '\0';
    local_c0[7] = '\0';
    local_d4 = Promise<int>::wait((Promise<int> *)&local_128,&local_f8);
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x50a,ERROR,
               "\"failed: expected \" \"(444) == (promise.wait(waitScope))\", _kjCondition, 444, promise.wait(waitScope)"
               ,(char (*) [52])"failed: expected (444) == (promise.wait(waitScope))",&local_118,
               (int *)&local_120,&local_d4);
  }
  local_118._0_8_ = (PromiseNode *)&local_129;
  if ((local_129 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x50b,ERROR,"\"failed: expected \" \"destroyed\", _kjCondition",
               (char (*) [27])"failed: expected destroyed",(DebugExpression<bool_&> *)&local_118);
  }
  OVar2.ptr = local_128.ptr;
  if ((TransformPromiseNodeBase *)local_128.ptr != (TransformPromiseNodeBase *)0x0) {
    local_128.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  if (local_e8 == 0) {
    EventLoop::leaveScope(local_f8);
  }
  EventLoop::~EventLoop(&local_a0);
  return;
}

Assistant:

TEST(Async, Attach) {
  bool destroyed = false;

  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() {
    EXPECT_FALSE(destroyed);
    return 123;
  }).attach(kj::heap<DestructorDetector>(destroyed));

  promise = promise.then([&](int i) {
    EXPECT_TRUE(destroyed);
    return i + 321;
  });

  EXPECT_FALSE(destroyed);
  EXPECT_EQ(444, promise.wait(waitScope));
  EXPECT_TRUE(destroyed);
}